

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double incircleexact(double *pa,double *pb,double *pc,double *pd)

{
  double b;
  double b_00;
  double b_01;
  double b_02;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double bc [4];
  double bd [4];
  double ac [4];
  double cd [4];
  double ab [4];
  double temp8 [8];
  double da [4];
  double dab [12];
  double cda [12];
  double abc [12];
  double det24y [24];
  double det24x [24];
  double bcd [12];
  double det48x [48];
  double cdet [96];
  double bdet [96];
  double adet [96];
  double det48y [48];
  double ddet [96];
  double deter [384];
  double cddet [192];
  double abdet [192];
  double local_2b68;
  double local_2b60;
  double local_2b58;
  double local_2b50;
  double local_2b48;
  undefined8 uStack_2b40;
  double local_2b38;
  undefined8 uStack_2b30;
  double local_2b28;
  undefined8 uStack_2b20;
  double local_2b18 [4];
  double local_2af8 [4];
  double local_2ad8;
  double local_2ad0;
  double local_2ac8;
  double local_2ac0;
  double local_2ab8;
  double local_2ab0;
  double local_2aa8;
  double local_2aa0;
  double local_2a98 [8];
  double local_2a58;
  double local_2a50;
  double local_2a48;
  double local_2a40;
  double local_2a38 [12];
  double local_29d8 [12];
  double local_2978 [12];
  double local_2918 [24];
  double local_2858 [24];
  double local_2798 [12];
  double local_2738 [48];
  double local_25b8 [96];
  double local_22b8 [96];
  double local_1fb8 [96];
  double local_1cb8 [48];
  double local_1b38 [95];
  double adStack_1840 [385];
  double local_c38 [192];
  double local_638 [193];
  
  b = *pa;
  b_00 = pa[1];
  b_01 = *pb;
  b_02 = pb[1];
  dVar7 = b * b_02;
  dVar13 = b * splitter - (b * splitter - b);
  dVar10 = b - dVar13;
  local_2b38 = b_02 * splitter - (b_02 * splitter - b_02);
  local_2b48 = b_02 - local_2b38;
  dVar9 = dVar10 * local_2b48 -
          (((dVar7 - dVar13 * local_2b38) - dVar10 * local_2b38) - dVar13 * local_2b48);
  dVar8 = b_01 * b_00;
  dVar15 = splitter * b_01 - (splitter * b_01 - b_01);
  dVar23 = splitter * b_00 - (splitter * b_00 - b_00);
  local_2b28 = b_01 - dVar15;
  dVar21 = b_00 - dVar23;
  dVar11 = local_2b28 * dVar21 -
           (((dVar8 - dVar15 * dVar23) - local_2b28 * dVar23) - dVar15 * dVar21);
  dVar16 = dVar9 - dVar11;
  local_2ab8 = (dVar9 - (dVar16 + (dVar9 - dVar16))) + ((dVar9 - dVar16) - dVar11);
  dVar9 = dVar7 + dVar16;
  dVar7 = (dVar7 - (dVar9 - (dVar9 - dVar7))) + (dVar16 - (dVar9 - dVar7));
  dVar11 = dVar7 - dVar8;
  local_2ab0 = (dVar7 - (dVar11 + (dVar7 - dVar11))) + ((dVar7 - dVar11) - dVar8);
  local_2aa0 = dVar9 + dVar11;
  local_2aa8 = (dVar9 - (local_2aa0 - (local_2aa0 - dVar9))) + (dVar11 - (local_2aa0 - dVar9));
  dVar7 = pc[1];
  dVar24 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar9 = b_01 * dVar7;
  uStack_2b20 = 0;
  dVar22 = dVar7 - dVar24;
  dVar16 = local_2b28 * dVar22 -
           (((dVar9 - dVar15 * dVar24) - local_2b28 * dVar24) - dVar15 * dVar22);
  dVar8 = *pc;
  dVar26 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar11 = b_02 * dVar8;
  uStack_2b30 = 0;
  dVar19 = dVar8 - dVar26;
  uStack_2b40 = 0;
  dVar12 = dVar19 * local_2b48 -
           (((dVar11 - dVar26 * local_2b38) - dVar19 * local_2b38) - dVar26 * local_2b48);
  dVar17 = dVar16 - dVar12;
  local_2b68 = (dVar16 - (dVar17 + (dVar16 - dVar17))) + ((dVar16 - dVar17) - dVar12);
  dVar16 = dVar9 + dVar17;
  dVar9 = (dVar9 - (dVar16 - (dVar16 - dVar9))) + (dVar17 - (dVar16 - dVar9));
  dVar12 = dVar9 - dVar11;
  local_2b60 = (dVar9 - (dVar12 + (dVar9 - dVar12))) + ((dVar9 - dVar12) - dVar11);
  local_2b50 = dVar16 + dVar12;
  local_2b58 = (dVar16 - (local_2b50 - (local_2b50 - dVar16))) + (dVar12 - (local_2b50 - dVar16));
  dVar9 = pd[1];
  dVar27 = splitter * dVar9 - (splitter * dVar9 - dVar9);
  dVar16 = dVar8 * dVar9;
  dVar25 = dVar9 - dVar27;
  dVar17 = dVar19 * dVar25 - (((dVar16 - dVar26 * dVar27) - dVar19 * dVar27) - dVar26 * dVar25);
  dVar11 = *pd;
  dVar20 = splitter * dVar11 - (splitter * dVar11 - dVar11);
  dVar14 = dVar7 * dVar11;
  dVar18 = dVar11 - dVar20;
  dVar28 = dVar18 * dVar22 - (((dVar14 - dVar20 * dVar24) - dVar18 * dVar24) - dVar20 * dVar22);
  dVar12 = dVar17 - dVar28;
  local_2ad8 = (dVar17 - (dVar12 + (dVar17 - dVar12))) + ((dVar17 - dVar12) - dVar28);
  dVar17 = dVar16 + dVar12;
  dVar16 = (dVar16 - (dVar17 - (dVar17 - dVar16))) + (dVar12 - (dVar17 - dVar16));
  dVar12 = dVar16 - dVar14;
  local_2ad0 = (dVar16 - (dVar12 + (dVar16 - dVar12))) + ((dVar16 - dVar12) - dVar14);
  local_2ac0 = dVar17 + dVar12;
  local_2ac8 = (dVar17 - (local_2ac0 - (local_2ac0 - dVar17))) + (dVar12 - (local_2ac0 - dVar17));
  dVar14 = b_00 * dVar11;
  dVar28 = dVar18 * dVar21 - (((dVar14 - dVar20 * dVar23) - dVar18 * dVar23) - dVar20 * dVar21);
  dVar17 = b * dVar9;
  dVar16 = dVar10 * dVar25 - (((dVar17 - dVar13 * dVar27) - dVar10 * dVar27) - dVar13 * dVar25);
  dVar12 = dVar28 - dVar16;
  local_2a58 = (dVar28 - (dVar12 + (dVar28 - dVar12))) + ((dVar28 - dVar12) - dVar16);
  dVar16 = dVar14 + dVar12;
  dVar14 = (dVar14 - (dVar16 - (dVar16 - dVar14))) + (dVar12 - (dVar16 - dVar14));
  dVar12 = dVar14 - dVar17;
  local_2a50 = (dVar14 - (dVar12 + (dVar14 - dVar12))) + ((dVar14 - dVar12) - dVar17);
  local_2a40 = dVar16 + dVar12;
  local_2a48 = (dVar16 - (local_2a40 - (local_2a40 - dVar16))) + (dVar12 - (local_2a40 - dVar16));
  dVar16 = b * dVar7;
  dVar14 = dVar22 * dVar10 - (((dVar16 - dVar13 * dVar24) - dVar24 * dVar10) - dVar13 * dVar22);
  dVar12 = b_00 * dVar8;
  dVar17 = dVar19 * dVar21 - (((dVar12 - dVar26 * dVar23) - dVar23 * dVar19) - dVar26 * dVar21);
  dVar10 = dVar14 - dVar17;
  local_2af8[0] = (dVar14 - (dVar10 + (dVar14 - dVar10))) + ((dVar14 - dVar10) - dVar17);
  dVar17 = dVar16 + dVar10;
  dVar16 = (dVar16 - (dVar17 - (dVar17 - dVar16))) + (dVar10 - (dVar17 - dVar16));
  dVar10 = dVar16 - dVar12;
  local_2af8[1] = (dVar16 - (dVar10 + (dVar16 - dVar10))) + ((dVar16 - dVar10) - dVar12);
  local_2af8[3] = dVar17 + dVar10;
  local_2af8[2] =
       (dVar17 - (local_2af8[3] - (local_2af8[3] - dVar17))) + (dVar10 - (local_2af8[3] - dVar17));
  dVar16 = b_01 * dVar9;
  dVar14 = dVar25 * local_2b28 -
           (((dVar16 - dVar15 * dVar27) - dVar27 * local_2b28) - dVar15 * dVar25);
  dVar12 = b_02 * dVar11;
  dVar17 = dVar18 * local_2b48 -
           (((dVar12 - dVar20 * local_2b38) - local_2b38 * dVar18) - dVar20 * local_2b48);
  dVar10 = dVar14 - dVar17;
  local_2b18[0] = (dVar14 - (dVar10 + (dVar14 - dVar10))) + ((dVar14 - dVar10) - dVar17);
  dVar17 = dVar16 + dVar10;
  dVar16 = (dVar16 - (dVar17 - (dVar17 - dVar16))) + (dVar10 - (dVar17 - dVar16));
  dVar10 = dVar16 - dVar12;
  local_2b18[1] = (dVar16 - (dVar10 + (dVar16 - dVar10))) + ((dVar16 - dVar10) - dVar12);
  local_2b18[3] = dVar17 + dVar10;
  local_2b18[2] =
       (dVar17 - (local_2b18[3] - (local_2b18[3] - dVar17))) + (dVar10 - (local_2b18[3] - dVar17));
  iVar1 = fast_expansion_sum_zeroelim(4,&local_2ad8,4,&local_2a58,local_2a98);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,local_2a98,4,local_2af8,local_29d8);
  iVar2 = fast_expansion_sum_zeroelim(4,&local_2a58,4,&local_2ab8,local_2a98);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_2a98,4,local_2b18,local_2a38);
  lVar6 = 0;
  do {
    local_2b18[lVar6] = -local_2b18[lVar6];
    local_2af8[lVar6] = -local_2af8[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  iVar3 = fast_expansion_sum_zeroelim(4,&local_2ab8,4,&local_2b68,local_2a98);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,local_2a98,4,local_2af8,local_2978);
  iVar4 = fast_expansion_sum_zeroelim(4,&local_2b68,4,&local_2ad8,local_2a98);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_2a98,4,local_2b18,local_2798);
  iVar5 = scale_expansion_zeroelim(iVar4,local_2798,b,local_2858);
  iVar5 = scale_expansion_zeroelim(iVar5,local_2858,b,local_2738);
  iVar4 = scale_expansion_zeroelim(iVar4,local_2798,b_00,local_2918);
  iVar4 = scale_expansion_zeroelim(iVar4,local_2918,b_00,local_1cb8);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,local_2738,iVar4,local_1cb8,local_1fb8);
  iVar5 = scale_expansion_zeroelim(iVar1,local_29d8,b_01,local_2858);
  iVar5 = scale_expansion_zeroelim(iVar5,local_2858,-b_01,local_2738);
  iVar1 = scale_expansion_zeroelim(iVar1,local_29d8,b_02,local_2918);
  iVar1 = scale_expansion_zeroelim(iVar1,local_2918,-b_02,local_1cb8);
  iVar1 = fast_expansion_sum_zeroelim(iVar5,local_2738,iVar1,local_1cb8,local_22b8);
  iVar5 = scale_expansion_zeroelim(iVar2,local_2a38,dVar8,local_2858);
  iVar5 = scale_expansion_zeroelim(iVar5,local_2858,dVar8,local_2738);
  iVar2 = scale_expansion_zeroelim(iVar2,local_2a38,dVar7,local_2918);
  iVar2 = scale_expansion_zeroelim(iVar2,local_2918,dVar7,local_1cb8);
  iVar2 = fast_expansion_sum_zeroelim(iVar5,local_2738,iVar2,local_1cb8,local_25b8);
  iVar5 = scale_expansion_zeroelim(iVar3,local_2978,dVar11,local_2858);
  iVar5 = scale_expansion_zeroelim(iVar5,local_2858,-dVar11,local_2738);
  iVar3 = scale_expansion_zeroelim(iVar3,local_2978,dVar9,local_2918);
  iVar3 = scale_expansion_zeroelim(iVar3,local_2918,-dVar9,local_1cb8);
  iVar3 = fast_expansion_sum_zeroelim(iVar5,local_2738,iVar3,local_1cb8,local_1b38);
  iVar1 = fast_expansion_sum_zeroelim(iVar4,local_1fb8,iVar1,local_22b8,local_638);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_25b8,iVar3,local_1b38,local_c38);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,local_638,iVar2,local_c38,adStack_1840 + 1);
  return adStack_1840[iVar1];
}

Assistant:

REAL incircleexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL det24x[24], det24y[24], det48x[48], det48y[48];
  int xlen, ylen;
  REAL adet[96], bdet[96], cdet[96], ddet[96];
  int alen, blen, clen, dlen;
  REAL abdet[192], cddet[192];
  int ablen, cdlen;
  REAL deter[384];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  xlen = scale_expansion_zeroelim(bcdlen, bcd, pa[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pa[0], det48x);
  ylen = scale_expansion_zeroelim(bcdlen, bcd, pa[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pa[1], det48y);
  alen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, adet);

  xlen = scale_expansion_zeroelim(cdalen, cda, pb[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pb[0], det48x);
  ylen = scale_expansion_zeroelim(cdalen, cda, pb[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pb[1], det48y);
  blen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, bdet);

  xlen = scale_expansion_zeroelim(dablen, dab, pc[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pc[0], det48x);
  ylen = scale_expansion_zeroelim(dablen, dab, pc[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pc[1], det48y);
  clen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, cdet);

  xlen = scale_expansion_zeroelim(abclen, abc, pd[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pd[0], det48x);
  ylen = scale_expansion_zeroelim(abclen, abc, pd[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pd[1], det48y);
  dlen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}